

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.c
# Opt level: O0

size_t utf8_check_full(char *buffer,size_t size,int32_t *codepoint)

{
  byte bVar1;
  uint local_34;
  uchar u;
  ulong uStack_30;
  int32_t value;
  size_t i;
  int32_t *codepoint_local;
  size_t size_local;
  char *buffer_local;
  
  bVar1 = *buffer;
  if (size == 2) {
    local_34 = bVar1 & 0x1f;
  }
  else if (size == 3) {
    local_34 = bVar1 & 0xf;
  }
  else {
    if (size != 4) {
      return 0;
    }
    local_34 = bVar1 & 7;
  }
  uStack_30 = 1;
  while( true ) {
    if (size <= uStack_30) {
      if ((int)local_34 < 0x110000) {
        if (((int)local_34 < 0xd800) || (0xdfff < (int)local_34)) {
          if ((((size == 2) && ((int)local_34 < 0x80)) || ((size == 3 && ((int)local_34 < 0x800))))
             || ((size == 4 && ((int)local_34 < 0x10000)))) {
            buffer_local = (char *)0x0;
          }
          else {
            if (codepoint != (int32_t *)0x0) {
              *codepoint = local_34;
            }
            buffer_local = (char *)0x1;
          }
        }
        else {
          buffer_local = (char *)0x0;
        }
      }
      else {
        buffer_local = (char *)0x0;
      }
      return (size_t)buffer_local;
    }
    bVar1 = buffer[uStack_30];
    if ((bVar1 < 0x80) || (0xbf < bVar1)) break;
    local_34 = local_34 * 0x40 + (bVar1 & 0x3f);
    uStack_30 = uStack_30 + 1;
  }
  return 0;
}

Assistant:

size_t utf8_check_full(const char *buffer, size_t size, int32_t *codepoint) {
    size_t i;
    int32_t value = 0;
    unsigned char u = (unsigned char) buffer[0];

    if (size == 2) {
        value = u & 0x1F;
    } else if (size == 3) {
        value = u & 0xF;
    } else if (size == 4) {
        value = u & 0x7;
    } else
        return 0;

    for (i = 1; i < size; i++) {
        u = (unsigned char) buffer[i];

        if (u < 0x80 || u > 0xBF) {
            /* not a continuation byte */
            return 0;
        }

        value = (value << 6) + (u & 0x3F);
    }

    if (value > 0x10FFFF) {
        /* not in Unicode range */
        return 0;
    } else if (0xD800 <= value && value <= 0xDFFF) {
        /* invalid code point (UTF-16 surrogate halves) */
        return 0;
    } else if ((size == 2 && value < 0x80) || (size == 3 && value < 0x800) ||
               (size == 4 && value < 0x10000)) {
        /* overlong encoding */
        return 0;
    }

    if (codepoint)
        *codepoint = value;

    return 1;
}